

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3CheckObjectName(Parse *pParse,char *zName)

{
  int iVar1;
  char *zName_local;
  Parse *pParse_local;
  
  if (((((pParse->db->init).busy == '\0') && (pParse->nested == '\0')) &&
      (iVar1 = sqlite3WritableSchema(pParse->db), iVar1 == 0)) &&
     (iVar1 = sqlite3_strnicmp(zName,"sqlite_",7), iVar1 == 0)) {
    sqlite3ErrorMsg(pParse,"object name reserved for internal use: %s",zName);
    return 1;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3CheckObjectName(Parse *pParse, const char *zName){
  if( !pParse->db->init.busy && pParse->nested==0 
          && sqlite3WritableSchema(pParse->db)==0
          && 0==sqlite3StrNICmp(zName, "sqlite_", 7) ){
    sqlite3ErrorMsg(pParse, "object name reserved for internal use: %s", zName);
    return SQLITE_ERROR;
  }
  return SQLITE_OK;
}